

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_ProdTypedTest_x_iutest_x_Friend_Test<int>::Body
          (iu_ProdTypedTest_x_iutest_x_Friend_Test<int> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_3f8;
  Fixed local_3c8;
  int local_240 [2];
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_208;
  Fixed local_1c8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_ProdTypedTest_x_iutest_x_Friend_Test<int> *this_local;
  
  iutest_ar._32_8_ = this;
  ProdClass::SetX((ProdClass *)s_prod,1);
  iutest::detail::AlwaysZero();
  local_40[1] = 1;
  local_40[0] = ProdClass::GetX((ProdClass *)s_prod);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"1","s_prod.GetX()",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x54,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    s_prod._4_4_ = 2;
    iutest::detail::AlwaysZero();
    local_240[1] = 2;
    local_240[0] = ProdClass::GetX((ProdClass *)s_prod);
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_238,"2","s_prod.GetX()",local_240 + 1,local_240);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                (&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
                 ,0x57,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_3f8,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper(&local_3f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(ProdTypedTest, Friend)
{
    s_prod.SetX(1);
    IUTEST_ASSERT_EQ(1, s_prod.GetX());

    s_prod.m_x = 2;
    IUTEST_ASSERT_EQ(2, s_prod.GetX());
}